

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O0

void google::protobuf::internal::arena_delete_object<std::__cxx11::string>(void *object)

{
  void *object_local;
  
  if (object != (void *)0x0) {
    std::__cxx11::string::~string((string *)object);
    operator_delete(object);
  }
  return;
}

Assistant:

void arena_delete_object(void* object) {
  delete reinterpret_cast<T*>(object);
}